

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_copy_bignum(sexp ctx,sexp dst,sexp a,sexp_uint_t len0)

{
  sexp in_RCX;
  long in_RDX;
  sexp in_RSI;
  sexp_uint_t size;
  sexp_uint_t len;
  sexp local_38;
  sexp local_10;
  
  local_38 = in_RCX;
  if (in_RCX == (sexp)0x0) {
    local_38 = *(sexp *)(in_RDX + 0x10);
  }
  if ((in_RSI == (sexp)0x0) || (local_10 = in_RSI, (in_RSI->value).type.cpl < local_38)) {
    local_10 = sexp_alloc_tagged_aux(in_RCX,(size_t)local_38,(long)local_38 * 8 + 0x18);
    (local_10->value).string.offset = (sexp_uint_t)local_38;
  }
  if (*(sexp *)(in_RDX + 0x10) < local_38) {
    local_38 = *(sexp *)(in_RDX + 0x10);
  }
  (local_10->value).flonum_bits[0] = *(char *)(in_RDX + 8);
  memset((void *)((long)&local_10->value + 0x10),0,(local_10->value).string.offset << 3);
  memmove((void *)((long)&local_10->value + 0x10),(void *)(in_RDX + 0x18),(long)local_38 << 3);
  return local_10;
}

Assistant:

sexp sexp_copy_bignum (sexp ctx, sexp dst, sexp a, sexp_uint_t len0) {
  sexp_uint_t len = (len0 > 0) ? len0 : sexp_bignum_length(a), size;
  size = sexp_sizeof(bignum) + len*sizeof(sexp_uint_t);
  if (! dst || sexp_bignum_length(dst) < len) {
    dst = sexp_alloc_tagged(ctx, size, SEXP_BIGNUM);
    sexp_bignum_length(dst) = len;
  }
  if (sexp_bignum_length(a) < len)
    len = sexp_bignum_length(a);

  sexp_bignum_sign(dst) = sexp_bignum_sign(a);
  memset(sexp_bignum_data(dst), 0,
         sexp_bignum_length(dst)*sizeof(sexp_uint_t));
  memmove(sexp_bignum_data(dst), sexp_bignum_data(a),
          len*sizeof(sexp_uint_t));
  return dst;
}